

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCMaterial.cpp
# Opt level: O0

void Assimp::IFC::FillMaterial(aiMaterial *mat,IfcSurfaceStyle *surf,ConversionData *conv)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  reference psVar3;
  element_type *peVar4;
  IfcSurfaceStyleShading *pIVar5;
  IfcColourRgb *in;
  __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var6;
  double *pdVar7;
  int local_554;
  float local_4cc;
  PrimitiveDataType<double> *pPStack_4c8;
  float e;
  REAL *rt;
  int shading;
  float t;
  IfcSurfaceStyleRendering *ren;
  aiColor4D col;
  aiColor4D col_base;
  IfcSurfaceStyleShading *shade;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> sel2;
  const_iterator __end2;
  const_iterator __begin2;
  Out *__range2;
  bool local_44a;
  allocator local_449;
  string local_448;
  undefined1 local_424 [8];
  aiString name;
  ConversionData *conv_local;
  IfcSurfaceStyle *surf_local;
  aiMaterial *mat_local;
  
  name.data._1016_8_ = conv;
  aiString::aiString((aiString *)local_424);
  local_44a = STEP::Maybe::operator_cast_to_bool
                        ((Maybe *)&(surf->super_IfcPresentationStyle).
                                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>
                                   .field_0x10);
  if (local_44a) {
    pbVar2 = STEP::
             Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::Get((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&(surf->super_IfcPresentationStyle).
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>.
                       field_0x10);
    std::__cxx11::string::string((string *)&local_448,(string *)pbVar2);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_448,"IfcSurfaceStyle_Unnamed",&local_449);
  }
  local_44a = !local_44a;
  aiString::Set((aiString *)local_424,&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  if (local_44a) {
    std::allocator<char>::~allocator((allocator<char> *)&local_449);
  }
  aiMaterial::AddProperty(mat,(aiString *)local_424,"?mat.name",0,0);
  __end2 = std::
           vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
           ::begin(&(surf->Styles).
                    super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                  );
  sel2.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
       ::end(&(surf->Styles).
              super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
            );
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_*,_std::vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>_>
                                     *)&sel2.
                                        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount), bVar1) {
    psVar3 = __gnu_cxx::
             __normal_iterator<const_std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_*,_std::vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>_>
             ::operator*(&__end2);
    std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr
              ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&shade,psVar3);
    peVar4 = std::
             __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&shade);
    pIVar5 = STEP::EXPRESS::DataType::
             ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading>
                       (peVar4,*(DB **)(name.data._1016_8_ + 0x18));
    if (pIVar5 != (IfcSurfaceStyleShading *)0x0) {
      aiColor4t<float>::aiColor4t((aiColor4t<float> *)&col.b);
      aiColor4t<float>::aiColor4t((aiColor4t<float> *)&ren);
      in = STEP::Lazy::operator_cast_to_IfcColourRgb_
                     ((Lazy *)&(pIVar5->
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>
                               ).field_0x10);
      ConvertColor((aiColor4D *)&col.b,in);
      aiMaterial::AddProperty(mat,(aiColor4D *)&col.b,1,"$clr.diffuse",0,0);
      _shading = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcSurfaceStyleRendering>
                           ((Object *)
                            ((long)&(pIVar5->
                                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>
                                    )._vptr_ObjectHelper +
                            (long)(pIVar5->
                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>
                                  )._vptr_ObjectHelper[-3]));
      if (_shading != (IfcSurfaceStyleRendering *)0x0) {
        bVar1 = STEP::Maybe::operator_cast_to_bool
                          ((Maybe *)&(_shading->super_IfcSurfaceStyleShading).field_0x28);
        if (bVar1) {
          pdVar7 = STEP::Maybe<double>::Get
                             ((Maybe<double> *)&(_shading->super_IfcSurfaceStyleShading).field_0x28)
          ;
          rt._4_4_ = 1.0 - (float)*pdVar7;
          aiMaterial::AddProperty(mat,(float *)((long)&rt + 4),1,"$mat.opacity",0,0);
        }
        bVar1 = STEP::Maybe::operator_cast_to_bool((Maybe *)&_shading->DiffuseColour);
        if (bVar1) {
          p_Var6 = (__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Get
                                (&_shading->DiffuseColour);
          peVar4 = std::
                   __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*(p_Var6);
          ConvertColor((aiColor4D *)&ren,peVar4,(ConversionData *)name.data._1016_8_,
                       (aiColor4D *)&col.b);
          aiMaterial::AddProperty(mat,(aiColor4D *)&ren,1,"$clr.diffuse",0,0);
        }
        bVar1 = STEP::Maybe::operator_cast_to_bool((Maybe *)&_shading->SpecularColour);
        if (bVar1) {
          p_Var6 = (__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Get
                                (&_shading->SpecularColour);
          peVar4 = std::
                   __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*(p_Var6);
          ConvertColor((aiColor4D *)&ren,peVar4,(ConversionData *)name.data._1016_8_,
                       (aiColor4D *)&col.b);
          aiMaterial::AddProperty(mat,(aiColor4D *)&ren,1,"$clr.specular",0,0);
        }
        bVar1 = STEP::Maybe::operator_cast_to_bool((Maybe *)&_shading->TransmissionColour);
        if (bVar1) {
          p_Var6 = (__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Get
                                (&_shading->TransmissionColour);
          peVar4 = std::
                   __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*(p_Var6);
          ConvertColor((aiColor4D *)&ren,peVar4,(ConversionData *)name.data._1016_8_,
                       (aiColor4D *)&col.b);
          aiMaterial::AddProperty(mat,(aiColor4D *)&ren,1,"$clr.transparent",0,0);
        }
        bVar1 = STEP::Maybe::operator_cast_to_bool((Maybe *)&_shading->ReflectionColour);
        if (bVar1) {
          p_Var6 = (__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Get
                                (&_shading->ReflectionColour);
          peVar4 = std::
                   __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*(p_Var6);
          ConvertColor((aiColor4D *)&ren,peVar4,(ConversionData *)name.data._1016_8_,
                       (aiColor4D *)&col.b);
          aiMaterial::AddProperty(mat,(aiColor4D *)&ren,1,"$clr.reflective",0,0);
        }
        bVar1 = STEP::Maybe::operator_cast_to_bool((Maybe *)&_shading->SpecularHighlight);
        if ((bVar1) &&
           (bVar1 = STEP::Maybe::operator_cast_to_bool((Maybe *)&_shading->SpecularColour), bVar1))
        {
          local_554 = ConvertShadingMode(&_shading->ReflectanceMethod);
        }
        else {
          local_554 = 2;
        }
        rt._0_4_ = local_554;
        aiMaterial::AddProperty(mat,(int *)&rt,1,"$mat.shadingm",0,0);
        bVar1 = STEP::Maybe::operator_cast_to_bool((Maybe *)&_shading->SpecularHighlight);
        if (bVar1) {
          p_Var6 = (__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Get
                                (&_shading->SpecularHighlight);
          peVar4 = std::
                   __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(p_Var6);
          pPStack_4c8 = STEP::EXPRESS::DataType::
                        ToPtr<Assimp::STEP::EXPRESS::PrimitiveDataType<double>>(peVar4);
          if (pPStack_4c8 == (PrimitiveDataType<double> *)0x0) {
            LogFunctions<Assimp::IFCImporter>::LogWarn
                      ("unexpected type error, SpecularHighlight should be a REAL");
          }
          else {
            pdVar7 = STEP::EXPRESS::PrimitiveDataType::operator_cast_to_double_
                               ((PrimitiveDataType *)pPStack_4c8);
            local_4cc = (float)*pdVar7;
            aiMaterial::AddProperty(mat,&local_4cc,1,"$mat.shininess",0,0);
          }
        }
      }
    }
    std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
              ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&shade);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_*,_std::vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

static void FillMaterial(aiMaterial* mat,const IFC::Schema_2x3::IfcSurfaceStyle* surf,ConversionData& conv) {
    aiString name;
    name.Set((surf->Name? surf->Name.Get() : "IfcSurfaceStyle_Unnamed"));
    mat->AddProperty(&name,AI_MATKEY_NAME);

    // now see which kinds of surface information are present
    for(std::shared_ptr< const IFC::Schema_2x3::IfcSurfaceStyleElementSelect > sel2 : surf->Styles) {
        if (const IFC::Schema_2x3::IfcSurfaceStyleShading* shade = sel2->ResolveSelectPtr<IFC::Schema_2x3::IfcSurfaceStyleShading>(conv.db)) {
            aiColor4D col_base,col;

            ConvertColor(col_base, shade->SurfaceColour);
            mat->AddProperty(&col_base,1, AI_MATKEY_COLOR_DIFFUSE);

            if (const IFC::Schema_2x3::IfcSurfaceStyleRendering* ren = shade->ToPtr<IFC::Schema_2x3::IfcSurfaceStyleRendering>()) {

                if (ren->Transparency) {
                    const float t = 1.f-static_cast<float>(ren->Transparency.Get());
                    mat->AddProperty(&t,1, AI_MATKEY_OPACITY);
                }

                if (ren->DiffuseColour) {
                    ConvertColor(col, *ren->DiffuseColour.Get(),conv,&col_base);
                    mat->AddProperty(&col,1, AI_MATKEY_COLOR_DIFFUSE);
                }

                if (ren->SpecularColour) {
                    ConvertColor(col, *ren->SpecularColour.Get(),conv,&col_base);
                    mat->AddProperty(&col,1, AI_MATKEY_COLOR_SPECULAR);
                }

                if (ren->TransmissionColour) {
                    ConvertColor(col, *ren->TransmissionColour.Get(),conv,&col_base);
                    mat->AddProperty(&col,1, AI_MATKEY_COLOR_TRANSPARENT);
                }

                if (ren->ReflectionColour) {
                    ConvertColor(col, *ren->ReflectionColour.Get(),conv,&col_base);
                    mat->AddProperty(&col,1, AI_MATKEY_COLOR_REFLECTIVE);
                }

                const int shading = (ren->SpecularHighlight && ren->SpecularColour)?ConvertShadingMode(ren->ReflectanceMethod):static_cast<int>(aiShadingMode_Gouraud);
                mat->AddProperty(&shading,1, AI_MATKEY_SHADING_MODEL);

                if (ren->SpecularHighlight) {
                    if(const ::Assimp::STEP::EXPRESS::REAL* rt = ren->SpecularHighlight.Get()->ToPtr<::Assimp::STEP::EXPRESS::REAL>()) {
                        // at this point we don't distinguish between the two distinct ways of
                        // specifying highlight intensities. leave this to the user.
                        const float e = static_cast<float>(*rt);
                        mat->AddProperty(&e,1,AI_MATKEY_SHININESS);
                    }
                    else {
                        IFCImporter::LogWarn("unexpected type error, SpecularHighlight should be a REAL");
                    }
                }
            }
        } 
    }
}